

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint32_t rebuild_hflags_a32(CPUARMState_conflict *env,int fp_el,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  ARMMMUIdx AVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  ARMMMUIdx in_ECX;
  ARMMMUIdx mmu_idx_00;
  
  AVar2 = rebuild_hflags_aprofile(env);
  _Var1 = arm_el_is_aa64(env,1);
  mmu_idx_00 = AVar2 | 0x4000;
  if (!_Var1) {
    mmu_idx_00 = AVar2;
  }
  iVar3 = arm_current_el(env);
  if ((iVar3 < 2) && ((env->cp15).hstr_el2 != 0)) {
    uVar5 = arm_hcr_el2_eff_aarch64(env);
    in_ECX = mmu_idx_00 | 0x10000;
    if ((~uVar5 & 0x408000000) != 0) {
      mmu_idx_00 = in_ECX;
    }
  }
  uVar4 = rebuild_hflags_common_32(env,fp_el,mmu_idx_00,in_ECX);
  return uVar4;
}

Assistant:

static uint32_t rebuild_hflags_a32(CPUARMState *env, int fp_el,
                                   ARMMMUIdx mmu_idx)
{
    uint32_t flags = rebuild_hflags_aprofile(env);

    if (arm_el_is_aa64(env, 1)) {
        FIELD_DP32(flags, TBFLAG_A32, VFPEN, 1, flags);
    }

    if (arm_current_el(env) < 2 && env->cp15.hstr_el2 &&
        (arm_hcr_el2_eff(env) & (HCR_E2H | HCR_TGE)) != (HCR_E2H | HCR_TGE)) {
        FIELD_DP32(flags, TBFLAG_A32, HSTR_ACTIVE, 1, flags);
    }

    return rebuild_hflags_common_32(env, fp_el, mmu_idx, flags);
}